

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

void __thiscall internalJSONNode::internalJSONNode(internalJSONNode *this,internalJSONNode *orig)

{
  json_index_t amount;
  uint uVar1;
  jsonChildren *pjVar2;
  JSONNode *item;
  long lVar3;
  JSONNode local_38;
  
  this->_type = orig->_type;
  std::__cxx11::string::string((string *)&this->_name,(string *)&orig->_name);
  this->_name_encoded = orig->_name_encoded;
  std::__cxx11::string::string((string *)&this->_string,(string *)&orig->_string);
  this->_string_encoded = orig->_string_encoded;
  this->_value = orig->_value;
  this->refcount = 1;
  this->fetched = orig->fetched;
  this->Children = (jsonChildren *)0x0;
  if ((this->_type & 0xfe) == 4) {
    pjVar2 = jsonChildren::newChildren();
    this->Children = pjVar2;
    amount = orig->Children->mysize;
    if (amount != 0) {
      jsonChildren::reserve(pjVar2,amount);
      uVar1 = orig->Children->mysize;
      for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
        pjVar2 = this->Children;
        ::JSONNode::duplicate(&local_38);
        item = ::JSONNode::newJSONNode(&local_38);
        jsonChildren::push_back(pjVar2,item);
        ::JSONNode::~JSONNode(&local_38);
      }
    }
  }
  return;
}

Assistant:

internalJSONNode::internalJSONNode(const internalJSONNode & orig) json_nothrow :
    _type(orig._type), _name(orig._name), _name_encoded(orig._name_encoded),
    _string(orig._string), _string_encoded(orig._string_encoded), _value(orig._value)
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(orig.fetched)
    initializeComment(orig._comment)
    initializeChildren(0){


    LIBJSON_COPY_CTOR;
    if (isContainer()){
	   CHILDREN = jsonChildren::newChildren();
	   if (json_likely(!orig.CHILDREN -> empty())){
		  CHILDREN -> reserve(orig.CHILDREN -> size());
		  json_foreach(orig.CHILDREN, myrunner){
			 CHILDREN -> push_back(JSONNode::newJSONNode((*myrunner) -> duplicate()));
		  }
	   }
    }
    #ifdef JSON_MUTEX_CALLBACKS /*-> JSON_MUTEX_CALLBACKS */
	   _set_mutex(orig.mylock, false);
    #endif /*<- */
}